

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

int pbrt::TexelBytes(PixelFormat format)

{
  int in_EDI;
  char *in_stack_00000088;
  int in_stack_00000094;
  char *in_stack_00000098;
  LogLevel in_stack_000000a4;
  undefined4 local_4;
  
  if (in_EDI == 0) {
    local_4 = 1;
  }
  else if (in_EDI == 1) {
    local_4 = 2;
  }
  else {
    if (in_EDI != 2) {
      LogFatal(in_stack_000000a4,in_stack_00000098,in_stack_00000094,in_stack_00000088);
    }
    local_4 = 4;
  }
  return local_4;
}

Assistant:

int TexelBytes(PixelFormat format) {
    switch (format) {
    case PixelFormat::U256:
        return 1;
    case PixelFormat::Half:
        return 2;
    case PixelFormat::Float:
        return 4;
    default:
        LOG_FATAL("Unhandled PixelFormat in TexelBytes()");
        return 0;
    }
}